

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

uint256 * __thiscall
CCoinsViewCache::GetBestBlock(uint256 *__return_storage_ptr__,CCoinsViewCache *this)

{
  uint256 *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->hashBlock;
  bVar8 = base_blob<256U>::IsNull(&this_00->super_base_blob<256U>);
  if (bVar8) {
    (*((this->super_CCoinsViewBacked).base)->_vptr_CCoinsView[2])(&local_40);
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10) = local_30;
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_28;
    *(undefined8 *)(this_00->super_base_blob<256U>).m_data._M_elems = local_40;
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8) = uStack_38;
  }
  uVar1 = *(undefined4 *)(this_00->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 4);
  uVar3 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar5 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar6 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar7 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x14) = uVar5;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x1c) = uVar7;
  *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar1;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) = uVar2;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar3;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 CCoinsViewCache::GetBestBlock() const {
    if (hashBlock.IsNull())
        hashBlock = base->GetBestBlock();
    return hashBlock;
}